

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O1

bool __thiscall
jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_number
          (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *this)

{
  semantic_tag sVar1;
  
  do {
    switch((byte)(this->field_0).json_const_pointer_ & 0xf) {
    case 2:
    case 3:
    case 5:
    case 6:
      return true;
    default:
      return false;
    case 7:
    case 0xf:
      sVar1 = tag(this);
      if (sVar1 == bigint) {
        return true;
      }
      sVar1 = tag(this);
      if (sVar1 == bigdec) {
        return true;
      }
      sVar1 = tag(this);
      return sVar1 == bigfloat;
    case 8:
    case 9:
      this = *(basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> **)
              ((long)&this->field_0 + 8);
    }
  } while( true );
}

Assistant:

bool is_number() const noexcept
        {
            switch (storage_kind())
            {
                case json_storage_kind::int64:
                case json_storage_kind::uint64:
                case json_storage_kind::half_float:
                case json_storage_kind::float64:
                    return true;
                case json_storage_kind::short_str:
                case json_storage_kind::long_str:
                    return tag() == semantic_tag::bigint ||
                           tag() == semantic_tag::bigdec ||
                           tag() == semantic_tag::bigfloat;
                case json_storage_kind::json_const_reference:
                    return cast<json_const_reference_storage>().value().is_number();
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().is_number();
                default:
                    return false;
            }
        }